

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runner.h
# Opt level: O2

void __thiscall TestRunner::RunTest<void(*)()>(TestRunner *this,_func_void *func,string *test_name)

{
  ostream *poVar1;
  
  (*func)();
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)test_name);
  poVar1 = std::operator<<(poVar1," OK");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void RunTest(TestFunc func, const string& test_name) {
        try {
            func();
            cerr << test_name << " OK" << endl;
        } catch (runtime_error& e) {
            ++fail_count;
            cerr << test_name << " fail: " << e.what() << endl;
        }
    }